

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPoolManager.cpp
# Opt level: O2

CommandPoolWrapper * __thiscall
Diligent::CommandPoolManager::AllocateCommandPool
          (CommandPoolWrapper *__return_storage_ptr__,CommandPoolManager *this,char *DebugName)

{
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *rhs;
  VkCommandPool cmdPool;
  string msg;
  VkCommandPoolCreateInfo local_40;
  
  std::mutex::lock(&this->m_Mutex);
  __return_storage_ptr__->m_VkObject = (VkCommandPool_T *)0x0;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (__return_storage_ptr__->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  rhs = (this->m_CmdPools).
        super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_CmdPools).
      super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != rhs) {
    VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>
    ::operator=(__return_storage_ptr__,rhs);
    std::
    deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_CmdPools);
    VulkanUtilities::VulkanLogicalDevice::ResetCommandPool
              (this->m_LogicalDevice,__return_storage_ptr__->m_VkObject,0);
    cmdPool = __return_storage_ptr__->m_VkObject;
    if (cmdPool != (VkCommandPool)0x0) goto LAB_001afa30;
  }
  local_40.pNext = (void *)0x0;
  local_40.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_40._4_4_ = 0;
  local_40.queueFamilyIndex = (uint32_t)(this->m_QueueFamilyIndex).m_Value;
  local_40.flags = this->m_CmdPoolFlags;
  VulkanUtilities::VulkanLogicalDevice::CreateCommandPool
            ((CommandPoolWrapper *)&msg,this->m_LogicalDevice,&local_40,"");
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  operator=(__return_storage_ptr__,
            (VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)&msg);
  VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)&msg)
  ;
  cmdPool = __return_storage_ptr__->m_VkObject;
  if (cmdPool == (VkCommandPool)0x0) {
    FormatString<char[37]>(&msg,(char (*) [37])"Failed to create Vulkan command pool");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"AllocateCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandPoolManager.cpp"
               ,0x46);
    std::__cxx11::string::~string((string *)&msg);
    cmdPool = __return_storage_ptr__->m_VkObject;
  }
LAB_001afa30:
  VulkanUtilities::SetCommandPoolName(this->m_LogicalDevice->m_VkDevice,cmdPool,DebugName);
  LOCK();
  (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i =
       (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::CommandPoolWrapper CommandPoolManager::AllocateCommandPool(const char* DebugName)
{
    std::lock_guard<std::mutex> LockGuard{m_Mutex};

    VulkanUtilities::CommandPoolWrapper CmdPool;
    if (!m_CmdPools.empty())
    {
        CmdPool = std::move(m_CmdPools.front());
        m_CmdPools.pop_front();

        m_LogicalDevice.ResetCommandPool(CmdPool);
    }

    if (CmdPool == VK_NULL_HANDLE)
    {
        VkCommandPoolCreateInfo CmdPoolCI = {};

        CmdPoolCI.sType            = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
        CmdPoolCI.pNext            = nullptr;
        CmdPoolCI.queueFamilyIndex = m_QueueFamilyIndex;
        CmdPoolCI.flags            = m_CmdPoolFlags;

        CmdPool = m_LogicalDevice.CreateCommandPool(CmdPoolCI);
        DEV_CHECK_ERR(CmdPool != VK_NULL_HANDLE, "Failed to create Vulkan command pool");
    }

    VulkanUtilities::SetCommandPoolName(m_LogicalDevice.GetVkDevice(), CmdPool, DebugName);

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    return CmdPool;
}